

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

bool QUtil::pdf_time_to_iso8601(string *pdf_time,string *iso8601)

{
  bool bVar1;
  QPDFTime *qtm_00;
  QPDFTime qtm;
  string local_58;
  QPDFTime local_34;
  
  bVar1 = pdf_time_to_qpdf_time(pdf_time,&local_34);
  if (bVar1) {
    qpdf_time_to_iso8601_abi_cxx11_(&local_58,(QUtil *)&local_34,qtm_00);
    std::__cxx11::string::operator=((string *)iso8601,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool
QUtil::pdf_time_to_iso8601(std::string const& pdf_time, std::string& iso8601)
{
    QPDFTime qtm;
    if (pdf_time_to_qpdf_time(pdf_time, &qtm)) {
        iso8601 = qpdf_time_to_iso8601(qtm);
        return true;
    }
    return false;
}